

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_basename(mcu8str *__return_storage_ptr__,mcu8str *path)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  mcu8str_size_t prealloc_size;
  char *__src;
  
  pcVar2 = path->c_str;
  uVar1 = path->size;
  iVar4 = mctools_impl_has_winnamespace(path);
  cVar3 = mctools_drive_letter(path);
  if (pcVar2 + (ulong)(cVar3 != '\0') * 2 + (ulong)(iVar4 != 0) * 4 != pcVar2 + uVar1) {
    pcVar6 = pcVar2 + uVar1;
    do {
      __src = pcVar6;
      pcVar6 = __src + -1;
      if ((pcVar6 <= pcVar2 + (ulong)(cVar3 != '\0') * 2 + (ulong)(iVar4 != 0) * 4) ||
         (*pcVar6 == '\\')) break;
    } while (*pcVar6 != '/');
    if ((*pcVar6 != '/') && (*pcVar6 != '\\')) {
      __src = pcVar6;
    }
    prealloc_size = (long)(pcVar2 + uVar1) - (long)__src;
    if ((prealloc_size != 0) && ((prealloc_size != 1 || (*__src != '.')))) {
      mcu8str_create(__return_storage_ptr__,prealloc_size);
      memcpy(__return_storage_ptr__->c_str,__src,prealloc_size + 1);
      lVar5 = 8;
      goto LAB_0010355e;
    }
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  prealloc_size = 0;
  lVar5 = 0x10;
LAB_0010355e:
  *(int *)((long)&__return_storage_ptr__->c_str + lVar5) = (int)prealloc_size;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_basename( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;

    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter

    if ( itB == itE )
      return mcu8str_create_empty();

    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    mcu8str_size_t bnsize = (mcu8str_size_t)(itE - it);
    if ( bnsize == 0 || ( bnsize==1 && *it=='.' ) )
      return mcu8str_create_empty();
    mcu8str res = mcu8str_create( bnsize );
    STDNS memcpy( res.c_str, it, bnsize + 1 );
    res.size = (unsigned)bnsize;//cast ok due to mcu8str_create
    return res;
  }